

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_mapper_test.cpp
# Opt level: O2

string * disp::to_string<int>(string *__return_storage_ptr__,int v)

{
  ostringstream ss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  ostringstream local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::ostream::operator<<((ostream *)local_190,v);
  std::__cxx11::stringbuf::str();
  std::operator+(&local_1b0,"to_str(",&local_1d0);
  std::operator+(__return_storage_ptr__,&local_1b0,")");
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

static std::string to_string(T v)
	{
		std::ostringstream ss;
		ss<<v;
		return "to_str(" + ss.str() + ")";
	}